

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

xmlIDPtr xmlAddID(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlChar *value,xmlAttrPtr attr)

{
  int iVar1;
  xmlValidCtxtPtr pxStack_38;
  int res;
  xmlIDPtr id;
  xmlAttrPtr attr_local;
  xmlChar *value_local;
  xmlDocPtr doc_local;
  xmlValidCtxtPtr ctxt_local;
  
  if ((attr == (xmlAttrPtr)0x0) || (doc != attr->doc)) {
    ctxt_local = (xmlValidCtxtPtr)0x0;
  }
  else {
    id = (xmlIDPtr)attr;
    attr_local = (xmlAttrPtr)value;
    value_local = (xmlChar *)doc;
    doc_local = (xmlDocPtr)ctxt;
    iVar1 = xmlAddIDInternal(attr,value,(xmlIDPtr *)&stack0xffffffffffffffc8);
    if (iVar1 < 0) {
      xmlVErrMemory((xmlValidCtxtPtr)doc_local);
    }
    else if ((iVar1 == 0) && (doc_local != (xmlDocPtr)0x0)) {
      xmlErrValidNode((xmlValidCtxtPtr)doc_local,(xmlNodePtr)id->doc,XML_DTD_ID_REDEFINED,
                      "ID %s already defined\n",(xmlChar *)attr_local,(xmlChar *)0x0,(xmlChar *)0x0)
      ;
    }
    ctxt_local = pxStack_38;
  }
  return (xmlIDPtr)ctxt_local;
}

Assistant:

xmlIDPtr
xmlAddID(xmlValidCtxtPtr ctxt, xmlDocPtr doc, const xmlChar *value,
         xmlAttrPtr attr) {
    xmlIDPtr id;
    int res;

    if ((attr == NULL) || (doc != attr->doc))
        return(NULL);

    res = xmlAddIDInternal(attr, value, &id);
    if (res < 0) {
        xmlVErrMemory(ctxt);
    }
#ifdef LIBXML_VALID_ENABLED
    else if (res == 0) {
        if (ctxt != NULL) {
            /*
             * The id is already defined in this DTD.
             */
            xmlErrValidNode(ctxt, attr->parent, XML_DTD_ID_REDEFINED,
                            "ID %s already defined\n", value, NULL, NULL);
        }
    }
#endif /* LIBXML_VALID_ENABLED */

    return(id);
}